

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O1

int64_t PhPacker::__phpack__detail::php_unpack_impl(char *data,int size,bool issigned,int *map)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  long local_8;
  
  local_8 = -(CONCAT71(in_register_00000011,issigned) & 0xffffffff);
  if (0 < size) {
    uVar1 = 0;
    do {
      *(char *)((long)&local_8 + (long)map[uVar1]) = data[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  return local_8;
}

Assistant:

int64_t php_unpack_impl(const char* data, int size, bool issigned, int* map) noexcept
{
    int64_t result {};
    char* cresult = reinterpret_cast<char*>(&result);

    result = issigned ? -1 : 0;

    for (int i = 0; i < size; ++i) {
        cresult[map[i]] = *data++;
    }
    return result;
}